

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp.cc
# Opt level: O2

void __thiscall fizplex::LP::add_row(LP *this,Row row)

{
  std::vector<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>::push_back(&this->rows,&row);
  ColMatrix::add_row(&this->A);
  DVector::resize(&this->b,((long)(this->rows).
                                  super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->rows).
                                 super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  set_b(this,((long)(this->rows).
                    super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->rows).
                   super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x18 - 1);
  return;
}

Assistant:

void LP::add_row(Row row) {
  rows.push_back(row);
  A.add_row();
  b.resize(rows.size());
  set_b(rows.size() - 1);
}